

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmLabel(SyntaxDumper *this,ExtGNU_AsmLabelSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_d0;
  SyntaxToken local_98;
  SyntaxToken local_50;
  ExtGNU_AsmLabelSyntax *local_18;
  ExtGNU_AsmLabelSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_AsmLabelSyntax *)this;
  ExtGNU_AsmLabelSyntax::asmKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_AsmLabelSyntax::openParenthesisToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  pEVar1 = ExtGNU_AsmLabelSyntax::stringLiteral(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_AsmLabelSyntax::closeParenthesisToken(&local_d0,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_d0,local_18);
  SyntaxToken::~SyntaxToken(&local_d0);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmLabel(const ExtGNU_AsmLabelSyntax* node) override
    {
        terminal(node->asmKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->stringLiteral());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }